

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

ggml_backend_buffer_t ggml_backend_alloc_buffer(ggml_backend_t backend,size_t size)

{
  ggml_backend_buffer_type_t pgVar1;
  ggml_backend_buffer_t pgVar2;
  
  pgVar1 = (*(backend->device->iface).get_buffer_type)(backend->device);
  if (size != 0) {
    pgVar2 = (*(pgVar1->iface).alloc_buffer)(pgVar1,size);
    return pgVar2;
  }
  pgVar2 = (ggml_backend_buffer_t)operator_new(0x68);
  (pgVar2->iface).free_buffer = (_func_void_ggml_backend_buffer_t *)0x0;
  (pgVar2->iface).get_base = (_func_void_ptr_ggml_backend_buffer_t *)0x0;
  (pgVar2->iface).init_tensor = (_func_ggml_status_ggml_backend_buffer_t_ggml_tensor_ptr *)0x0;
  (pgVar2->iface).memset_tensor =
       (_func_void_ggml_backend_buffer_t_ggml_tensor_ptr_uint8_t_size_t_size_t *)0x0;
  (pgVar2->iface).set_tensor =
       (_func_void_ggml_backend_buffer_t_ggml_tensor_ptr_void_ptr_size_t_size_t *)0x0;
  (pgVar2->iface).get_tensor =
       (_func_void_ggml_backend_buffer_t_ggml_tensor_ptr_void_ptr_size_t_size_t *)0x0;
  (pgVar2->iface).cpy_tensor =
       (_func__Bool_ggml_backend_buffer_t_ggml_tensor_ptr_ggml_tensor_ptr *)0x0;
  (pgVar2->iface).clear = (_func_void_ggml_backend_buffer_t_uint8_t *)0x0;
  (pgVar2->iface).reset = (_func_void_ggml_backend_buffer_t *)0x0;
  pgVar2->buft = pgVar1;
  pgVar2->context = (void *)0x0;
  pgVar2->size = 0;
  pgVar2->usage = GGML_BACKEND_BUFFER_USAGE_ANY;
  return pgVar2;
}

Assistant:

ggml_backend_buffer_t ggml_backend_alloc_buffer(ggml_backend_t backend, size_t size) {
    return ggml_backend_buft_alloc_buffer(ggml_backend_get_default_buffer_type(backend), size);
}